

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object.hpp
# Opt level: O0

Boxed_Value * __thiscall
chaiscript::dispatch::Dynamic_Object::method_missing(Dynamic_Object *this,string *t_method_name)

{
  option_explicit_set *this_00;
  Boxed_Value *pBVar1;
  bool local_35;
  _Self local_28;
  _Self local_20;
  string *local_18;
  string *t_method_name_local;
  Dynamic_Object *this_local;
  
  local_35 = false;
  local_18 = t_method_name;
  t_method_name_local = &this->m_type_name;
  if ((this->m_option_explicit & 1U) != 0) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
         ::find(&this->m_attrs,t_method_name);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
         ::end(&this->m_attrs);
    local_35 = std::operator==(&local_20,&local_28);
  }
  if (local_35 == false) {
    pBVar1 = get_attr(this,local_18);
    return pBVar1;
  }
  this_00 = (option_explicit_set *)__cxa_allocate_exception(0x10);
  option_explicit_set::option_explicit_set(this_00,local_18);
  __cxa_throw(this_00,&option_explicit_set::typeinfo,option_explicit_set::~option_explicit_set);
}

Assistant:

const Boxed_Value &method_missing(const std::string &t_method_name) const {
        if (m_option_explicit && m_attrs.find(t_method_name) == m_attrs.end()) {
          throw option_explicit_set(t_method_name);
        }

        return get_attr(t_method_name);
      }